

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

void __thiscall w3Module::read_section(w3Module *this,uint8_t **cursor)

{
  byte bVar1;
  uint32_t uVar2;
  long *plVar3;
  code *local_120;
  string local_d8;
  w3Section *local_b8;
  w3Section *section;
  string local_90;
  PCH local_70;
  PCH local_name;
  ulong uStack_60;
  uint32_t name_size;
  size_t payload_size;
  string local_48;
  uint local_24;
  uint8_t *puStack_20;
  uint32_t id;
  uint8_t *payload;
  uint8_t **cursor_local;
  w3Module *this_local;
  
  puStack_20 = *cursor;
  payload = (uint8_t *)cursor;
  cursor_local = (uint8_t **)this;
  bVar1 = read_varuint7(this,cursor);
  local_24 = (uint)bVar1;
  if (0xb < local_24) {
    StringFormat_abi_cxx11_
              (&local_48,"malformed line:%d id:%X payload:%p base:%p end:%p",0x296,(ulong)local_24,
               puStack_20,this->base,this->end);
    ThrowString(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  printf("%s(%d) read_section offset:%lX\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x298,
         *(long *)payload - (long)this->base);
  uVar2 = read_varuint32(this,(uint8_t **)payload);
  uStack_60 = (ulong)uVar2;
  printf("%s payload_size:%lX\n","read_section",uStack_60);
  puStack_20 = *(uint8_t **)payload;
  local_name._4_4_ = 0;
  local_70 = (PCH)0x0;
  if (local_24 == 0) {
    local_name._4_4_ = read_varuint32(this,(uint8_t **)payload);
    local_70 = *(PCH *)payload;
    if (this->end < local_70 + local_name._4_4_) {
      StringFormat_abi_cxx11_(&local_90,"malformed %d",0x2a4);
      ThrowString(&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  if (this->end < puStack_20 + uStack_60) {
    StringFormat_abi_cxx11_
              ((string *)&section,
               "malformed line:%d id:%X payload:%p payload_size:%lX base:%p end:%p",0x2a7,
               (ulong)local_24,puStack_20,uStack_60,this->base,this->end);
    ThrowString((string *)&section);
    std::__cxx11::string::~string((string *)&section);
  }
  printf("%s(%d) read_section offset:%lX\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x2a9,
         *(long *)payload - (long)this->base);
  *(uint8_t **)payload = puStack_20 + uStack_60;
  if (local_24 == 0) {
    if (local_name._4_4_ < 0x7fffffff) {
      printf("skipping custom section:.%.*s\n",(ulong)local_name._4_4_,local_70);
    }
  }
  else {
    printf("%s(%d)\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x2b5
          );
    local_b8 = this->sections + local_24;
    local_b8->id = local_24;
    (local_b8->name).data = local_70;
    (local_b8->name).size = (ulong)local_name._4_4_;
    local_b8->payload_size = uStack_60;
    local_b8->payload = puStack_20;
    printf("%s(%d) %d\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3Module.cpp",0x2be
           ,(ulong)local_24);
    local_120 = (code *)section_traits[local_24].read;
    plVar3 = (long *)((long)this->sections + *(long *)&section_traits[local_24].field_0x8 + -0x58);
    if (((ulong)local_120 & 1) != 0) {
      local_120 = *(code **)(local_120 + *plVar3 + -1);
    }
    (*local_120)(plVar3,&stack0xffffffffffffffe0);
    if (puStack_20 != *(uint8_t **)payload) {
      StringFormat_abi_cxx11_
                (&local_d8,"failed to read section:%X payload:%p cursor:%p\n",(ulong)local_24,
                 puStack_20,*(undefined8 *)payload);
      ThrowString(&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
  }
  return;
}

Assistant:

void w3Module::read_section (uint8_t** cursor)
{
    uint8_t* payload = *cursor;
    const uint32_t id = read_varuint7 (cursor);

    if (id > 11)
        ThrowString (StringFormat ("malformed line:%d id:%X payload:%p base:%p end:%p", __LINE__, id, payload, base, end)); // UNDONE context

    printf ("%s(%d) read_section offset:%" FORMAT_SIZE "X\n", __FILE__, __LINE__, (long_t)(*cursor - this->base));

    const size_t payload_size = read_varuint32 (cursor);
    printf ("%s payload_size:%" FORMAT_SIZE "X\n", __func__, (long_t)payload_size);
    payload = *cursor;
    uint32_t name_size = 0;
    PCH local_name = 0;
    if (id == 0)
    {
        name_size = read_varuint32 (cursor);
        local_name = (PCH)*cursor;
        if (local_name + name_size > (PCH)end)
            ThrowString (StringFormat ("malformed %d", __LINE__)); // UNDONE context (move to module or section)
    }
    if (payload + payload_size > end)
        ThrowString (StringFormat ("malformed line:%d id:%X payload:%p payload_size:%" FORMAT_SIZE "X base:%p end:%p", __LINE__, id, payload, (long_t)payload_size, base, end)); // UNDONE context

    printf ("%s(%d) read_section offset:%" FORMAT_SIZE "X\n", __FILE__, __LINE__, (long_t)(*cursor - this->base));

    *cursor = payload + payload_size;

    if (id == 0)
    {
        if (name_size < INT_MAX)
            printf ("skipping custom section:.%.*s\n", (int)name_size, local_name);
        // UNDONE custom sections
        return;
    }

    printf("%s(%d)\n", __FILE__, __LINE__);

    w3Section& section = sections [id];
    section.id = id;
    section.name.data = local_name;
    section.name.size = name_size;
    section.payload_size = payload_size;
    section.payload = payload;

    printf("%s(%d) %d\n", __FILE__, __LINE__, (int)id);
    //DebugBreak ();

    (this->*section_traits [id].read) (&payload);

    if (payload != *cursor)
        ThrowString (StringFormat ("failed to read section:%X payload:%p cursor:%p\n", id, payload, *cursor));
}